

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TorsionTypeParser.cpp
# Opt level: O3

TorsionType * __thiscall OpenMD::TorsionTypeParser::parseLine(TorsionTypeParser *this,string *line)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  RealType RVar3;
  TorsionTypeParser *pTVar4;
  uint uVar5;
  uint uVar6;
  iterator iVar7;
  long lVar8;
  mapped_type_conflict *pmVar9;
  CharmmTorsionType *this_00;
  OpenMDException *pOVar10;
  uint uVar11;
  _Rb_tree_color _Var12;
  ulong uVar13;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  uint uVar15;
  double dVar14;
  vector<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_> parameters
  ;
  CharmmTorsionParameter currParam;
  StringTokenizer tokenizer;
  string local_118;
  undefined1 local_f8 [16];
  TorsionTypeParser *local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  CharmmTorsionParameter local_a8;
  _Base_ptr local_90;
  StringTokenizer local_88;
  
  paVar1 = &local_118.field_2;
  local_118._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118," ;\t\n\r","");
  StringTokenizer::StringTokenizer(&local_88,line,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar1) {
    operator_delete(local_118._M_dataplus._M_p,(ulong)(local_118.field_2._M_allocated_capacity + 1))
    ;
  }
  uVar5 = StringTokenizer::countTokens(&local_88);
  if ((int)uVar5 < 1) {
    pOVar10 = (OpenMDException *)__cxa_allocate_exception(0x28);
    local_118._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_118,"TorsionTypeParser: Not enough tokens","");
    OpenMDException::OpenMDException(pOVar10,&local_118);
    __cxa_throw(pOVar10,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
  }
  StringTokenizer::nextToken_abi_cxx11_(&local_118,&local_88);
  iVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::TorsionTypeParser::TorsionTypeEnum>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::TorsionTypeParser::TorsionTypeEnum>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::TorsionTypeParser::TorsionTypeEnum>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::TorsionTypeParser::TorsionTypeEnum>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::TorsionTypeParser::TorsionTypeEnum>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::TorsionTypeParser::TorsionTypeEnum>_>_>
                  *)this,&local_118);
  if ((_Rb_tree_header *)iVar7._M_node ==
      &(this->stringToEnumMap_)._M_t._M_impl.super__Rb_tree_header) {
    _Var12 = 8;
  }
  else {
    _Var12 = iVar7._M_node[2]._M_color;
  }
  local_e0 = this;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar1) {
    operator_delete(local_118._M_dataplus._M_p,(ulong)(local_118.field_2._M_allocated_capacity + 1))
    ;
  }
  pTVar4 = local_e0;
  if (7 < _Var12) {
    pOVar10 = (OpenMDException *)__cxa_allocate_exception(0x28);
    local_118._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_118,"TorsionTypeParser: Unknown Torsion Type","");
    OpenMDException::OpenMDException(pOVar10,&local_118);
    __cxa_throw(pOVar10,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
  }
  uVar11 = uVar5 - 1;
  switch(_Var12) {
  case _S_red:
    if (uVar5 < 5) {
      pOVar10 = (OpenMDException *)__cxa_allocate_exception(0x28);
      local_118._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_118,"TorsionTypeParser: Not enough tokens","");
      OpenMDException::OpenMDException(pOVar10,&local_118);
      __cxa_throw(pOVar10,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    RVar3 = StringTokenizer::nextTokenAsDouble(&local_88);
    pTVar4 = local_e0;
    local_d8._8_4_ = extraout_XMM0_Dc;
    local_d8._0_8_ = RVar3;
    local_d8._12_4_ = extraout_XMM0_Dd;
    local_f8._0_8_ = StringTokenizer::nextTokenAsDouble(&local_88);
    RVar3 = StringTokenizer::nextTokenAsDouble(&local_88);
    local_c8._8_4_ = extraout_XMM0_Dc_00;
    local_c8._0_8_ = RVar3;
    local_c8._12_4_ = extraout_XMM0_Dd_00;
    local_b8._0_8_ = StringTokenizer::nextTokenAsDouble(&local_88);
    if (pTVar4->trans180_ == true) {
      this_00 = (CharmmTorsionType *)operator_new(0x28);
      goto LAB_0022398f;
    }
    this_00 = (CharmmTorsionType *)operator_new(0x28);
LAB_00223ae2:
    (this_00->super_TorsionType)._vptr_TorsionType = (_func_int **)&PTR__TorsionType_002fb858;
    *(ulong *)&(this_00->T_).polyPairMap_._M_t._M_impl = local_d8._0_8_ ^ 0x8000000000000000;
    *(undefined8 *)&(this_00->T_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header =
         local_f8._0_8_;
    (this_00->T_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)(local_c8._0_8_ ^ 0x8000000000000000);
    goto LAB_00223b23;
  case _S_black:
    if (uVar5 < 5) {
      pOVar10 = (OpenMDException *)__cxa_allocate_exception(0x28);
      local_118._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_118,"TorsionTypeParser: Not enough tokens","");
      OpenMDException::OpenMDException(pOVar10,&local_118);
      __cxa_throw(pOVar10,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    RVar3 = StringTokenizer::nextTokenAsDouble(&local_88);
    pTVar4 = local_e0;
    local_d8._8_4_ = extraout_XMM0_Dc_04;
    local_d8._0_8_ = RVar3;
    local_d8._12_4_ = extraout_XMM0_Dd_04;
    local_f8._0_8_ = StringTokenizer::nextTokenAsDouble(&local_88);
    RVar3 = StringTokenizer::nextTokenAsDouble(&local_88);
    local_c8._8_4_ = extraout_XMM0_Dc_05;
    local_c8._0_8_ = RVar3;
    local_c8._12_4_ = extraout_XMM0_Dd_05;
    local_b8._0_8_ = StringTokenizer::nextTokenAsDouble(&local_88);
    if (pTVar4->trans180_ != true) {
      this_00 = (CharmmTorsionType *)operator_new(0x28);
      goto LAB_00223ae2;
    }
    this_00 = (CharmmTorsionType *)operator_new(0x28);
LAB_0022398f:
    (this_00->super_TorsionType)._vptr_TorsionType = (_func_int **)&PTR__TorsionType_002fb858;
    *(undefined8 *)&(this_00->T_).polyPairMap_._M_t._M_impl = local_d8._0_8_;
    *(undefined8 *)&(this_00->T_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header =
         local_f8._0_8_;
    (this_00->T_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)local_c8._0_8_;
LAB_00223b23:
    (this_00->T_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)local_b8._0_8_;
    break;
  case 2:
    if (uVar5 < 6) {
      pOVar10 = (OpenMDException *)__cxa_allocate_exception(0x28);
      local_118._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_118,"TorsionTypeParser: Not enough tokens","");
      OpenMDException::OpenMDException(pOVar10,&local_118);
      __cxa_throw(pOVar10,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_d8._0_8_ = StringTokenizer::nextTokenAsDouble(&local_88);
    RVar3 = StringTokenizer::nextTokenAsDouble(&local_88);
    pTVar4 = local_e0;
    local_f8._8_4_ = extraout_XMM0_Dc_01;
    local_f8._0_8_ = RVar3;
    local_f8._12_4_ = extraout_XMM0_Dd_01;
    local_c8._0_8_ = StringTokenizer::nextTokenAsDouble(&local_88);
    RVar3 = StringTokenizer::nextTokenAsDouble(&local_88);
    local_b8._8_4_ = extraout_XMM0_Dc_02;
    local_b8._0_8_ = RVar3;
    local_b8._12_4_ = extraout_XMM0_Dd_02;
    local_90 = (_Base_ptr)StringTokenizer::nextTokenAsDouble(&local_88);
    if (pTVar4->trans180_ == true) {
      this_00 = (CharmmTorsionType *)operator_new(0x30);
      (this_00->super_TorsionType)._vptr_TorsionType = (_func_int **)&PTR__TorsionType_002fb898;
      *(undefined8 *)&(this_00->T_).polyPairMap_._M_t._M_impl = local_d8._0_8_;
      *(undefined8 *)&(this_00->T_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header =
           local_f8._0_8_;
      (this_00->T_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)local_c8._0_8_;
      (this_00->T_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)local_b8._0_8_;
    }
    else {
      this_00 = (CharmmTorsionType *)operator_new(0x30);
      (this_00->super_TorsionType)._vptr_TorsionType = (_func_int **)&PTR__TorsionType_002fb898;
      *(undefined8 *)&(this_00->T_).polyPairMap_._M_t._M_impl = local_d8._0_8_;
      *(ulong *)&(this_00->T_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header =
           local_f8._0_8_ ^ 0x8000000000000000;
      (this_00->T_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)local_c8._0_8_;
      (this_00->T_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)(local_b8._0_8_ ^ 0x8000000000000000);
    }
    (this_00->T_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_90;
    break;
  case 3:
    if ((uVar5 < 3) || ((uVar11 & 1) != 0)) {
      pOVar10 = (OpenMDException *)__cxa_allocate_exception(0x28);
      local_118._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_118,"TorsionTypeParser: Not enough tokens","");
      OpenMDException::OpenMDException(pOVar10,&local_118);
      __cxa_throw(pOVar10,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_f8._0_8_ = operator_new(0x38);
    uVar11 = uVar11 >> 1;
    *(undefined ***)local_f8._0_8_ = &PTR__PolynomialTorsionType_002fb8d8;
    *(undefined4 *)(local_f8._0_8_ + 0x10) = 0;
    *(undefined8 *)(local_f8._0_8_ + 0x18) = 0;
    *(undefined8 **)(local_f8._0_8_ + 0x20) = (undefined8 *)(local_f8._0_8_ + 0x10);
    *(undefined8 **)(local_f8._0_8_ + 0x28) = (undefined8 *)(local_f8._0_8_ + 0x10);
    *(undefined8 *)(local_f8._0_8_ + 0x30) = 0;
    lVar8 = __dynamic_cast(local_f8._0_8_,&TorsionType::typeinfo,&PolynomialTorsionType::typeinfo,0)
    ;
    do {
      uVar6 = StringTokenizer::nextTokenAsInt(&local_88);
      RVar3 = StringTokenizer::nextTokenAsDouble(&local_88);
      local_d8._8_4_ = extraout_XMM0_Dc_03;
      local_d8._0_8_ = RVar3;
      local_d8._12_4_ = extraout_XMM0_Dd_03;
      bVar2 = local_e0->trans180_;
      local_118._M_dataplus._M_p._0_4_ = uVar6;
      pmVar9 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)(lVar8 + 8),(key_type *)&local_118);
      uVar5 = local_d8._4_4_;
      if (bVar2 == false) {
        uVar5 = local_d8._4_4_ ^ 0x80000000;
      }
      uVar15 = local_d8._4_4_;
      if ((uVar6 & 1) != 0) {
        uVar15 = uVar5;
      }
      *(undefined4 *)pmVar9 = local_d8._0_4_;
      *(uint *)((long)pmVar9 + 4) = uVar15;
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
    this_00 = (CharmmTorsionType *)local_f8._0_8_;
    break;
  case 4:
    if ((uVar5 < 4) || (uVar13 = (ulong)uVar11 / 3, uVar11 % 3 != 0)) {
      pOVar10 = (OpenMDException *)__cxa_allocate_exception(0x28);
      local_118._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_118,"TorsionTypeParser: Not enough tokens","");
      OpenMDException::OpenMDException(pOVar10,&local_118);
      __cxa_throw(pOVar10,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_118._M_dataplus._M_p = (pointer)0x0;
    local_118._M_string_length = 0;
    local_118.field_2._M_allocated_capacity = 0;
    do {
      local_a8.kchi = StringTokenizer::nextTokenAsDouble(&local_88);
      local_a8.n = StringTokenizer::nextTokenAsInt(&local_88);
      RVar3 = StringTokenizer::nextTokenAsDouble(&local_88);
      local_a8.delta = (RVar3 / 180.0) * 3.141592653589793;
      if ((pTVar4->trans180_ == false) &&
         (local_a8.delta = 3.141592653589793 - local_a8.delta, (local_a8.n & 1U) != 0)) {
        local_a8.kchi = -local_a8.kchi;
      }
      if (local_118._M_string_length == local_118.field_2._M_allocated_capacity) {
        std::vector<OpenMD::CharmmTorsionParameter,std::allocator<OpenMD::CharmmTorsionParameter>>::
        _M_realloc_insert<OpenMD::CharmmTorsionParameter_const&>
                  ((vector<OpenMD::CharmmTorsionParameter,std::allocator<OpenMD::CharmmTorsionParameter>>
                    *)&local_118,(iterator)local_118._M_string_length,&local_a8);
      }
      else {
        *(RealType *)(local_118._M_string_length + 0x10) = local_a8.delta;
        *(RealType *)local_118._M_string_length = local_a8.kchi;
        *(ulong *)(local_118._M_string_length + 8) = CONCAT44(local_a8._12_4_,local_a8.n);
        local_118._M_string_length = local_118._M_string_length + 0x18;
      }
      uVar5 = (int)uVar13 - 1;
      uVar13 = (ulong)uVar5;
    } while (uVar5 != 0);
    this_00 = (CharmmTorsionType *)operator_new(0x70);
    CharmmTorsionType::CharmmTorsionType
              (this_00,(vector<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>
                        *)&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_118._M_dataplus._M_p,
                      local_118.field_2._M_allocated_capacity - (long)local_118._M_dataplus._M_p);
    }
    break;
  case 5:
    if (uVar5 < 4) {
      pOVar10 = (OpenMDException *)__cxa_allocate_exception(0x28);
      local_118._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_118,"TorsionTypeParser: Not enough tokens","");
      OpenMDException::OpenMDException(pOVar10,&local_118);
      __cxa_throw(pOVar10,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_d8._0_8_ = StringTokenizer::nextTokenAsDouble(&local_88);
    pTVar4 = local_e0;
    local_f8._0_8_ = StringTokenizer::nextTokenAsDouble(&local_88);
    local_c8._0_8_ = StringTokenizer::nextTokenAsDouble(&local_88);
    this_00 = (CharmmTorsionType *)operator_new(0x50);
    OplsTorsionType::OplsTorsionType
              ((OplsTorsionType *)this_00,(RealType)local_d8._0_8_,(RealType)local_f8._0_8_,
               (RealType)local_c8._0_8_,pTVar4->trans180_);
    break;
  case 6:
    if (uVar5 < 5) {
      pOVar10 = (OpenMDException *)__cxa_allocate_exception(0x28);
      local_118._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_118,"TorsionTypeParser: Not enough tokens","");
      OpenMDException::OpenMDException(pOVar10,&local_118);
      __cxa_throw(pOVar10,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_d8._0_8_ = StringTokenizer::nextTokenAsDouble(&local_88);
    pTVar4 = local_e0;
    local_f8._0_8_ = StringTokenizer::nextTokenAsDouble(&local_88);
    local_c8._0_8_ = StringTokenizer::nextTokenAsDouble(&local_88);
    local_b8._0_8_ = StringTokenizer::nextTokenAsDouble(&local_88);
    this_00 = (CharmmTorsionType *)operator_new(0x58);
    TrappeTorsionType::TrappeTorsionType
              ((TrappeTorsionType *)this_00,(RealType)local_d8._0_8_,(RealType)local_f8._0_8_,
               (RealType)local_c8._0_8_,(RealType)local_b8._0_8_,pTVar4->trans180_);
    break;
  case 7:
    if (uVar5 < 3) {
      pOVar10 = (OpenMDException *)__cxa_allocate_exception(0x28);
      local_118._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_118,"TorsionTypeParser: Not enough tokens","");
      OpenMDException::OpenMDException(pOVar10,&local_118);
      __cxa_throw(pOVar10,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_d8._0_8_ = StringTokenizer::nextTokenAsDouble(&local_88);
    pTVar4 = local_e0;
    local_f8._0_8_ = StringTokenizer::nextTokenAsDouble(&local_88);
    bVar2 = pTVar4->trans180_;
    this_00 = (CharmmTorsionType *)operator_new(0x18);
    dVar14 = (double)local_d8._0_8_ / 57.29577951308232;
    if (bVar2 == false) {
      dVar14 = 3.141592653589793 - dVar14;
    }
    (this_00->super_TorsionType)._vptr_TorsionType = (_func_int **)&PTR__TorsionType_002fb980;
    *(double *)&(this_00->T_).polyPairMap_._M_t._M_impl = (double)local_f8._0_8_ * 3282.806350011744
    ;
    *(double *)&(this_00->T_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header = dVar14;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.delim_._M_dataplus._M_p != &local_88.delim_.field_2) {
    operator_delete(local_88.delim_._M_dataplus._M_p,
                    local_88.delim_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.tokenString_._M_dataplus._M_p != &local_88.tokenString_.field_2) {
    operator_delete(local_88.tokenString_._M_dataplus._M_p,
                    local_88.tokenString_.field_2._M_allocated_capacity + 1);
  }
  return &this_00->super_TorsionType;
}

Assistant:

TorsionType* TorsionTypeParser::parseLine(const std::string& line) {
    StringTokenizer tokenizer(line);
    TorsionType* torsionType = NULL;
    int nTokens              = tokenizer.countTokens();

    if (nTokens < 1) {
      throw OpenMDException("TorsionTypeParser: Not enough tokens");
    }

    TorsionTypeEnum tt = getTorsionTypeEnum(tokenizer.nextToken());

    nTokens -= 1;

    switch (tt) {
    case ttGhostTorsion:
      if (nTokens < 4) {
        throw OpenMDException("TorsionTypeParser: Not enough tokens");
      } else {
        RealType k3 = tokenizer.nextTokenAsDouble();
        RealType k2 = tokenizer.nextTokenAsDouble();
        RealType k1 = tokenizer.nextTokenAsDouble();
        RealType k0 = tokenizer.nextTokenAsDouble();

        if (trans180_)
          torsionType = new CubicTorsionType(k3, k2, k1, k0);
        else
          torsionType = new CubicTorsionType(-k3, k2, -k1, k0);
      }
      break;

    case ttCubic:
      if (nTokens < 4) {
        throw OpenMDException("TorsionTypeParser: Not enough tokens");
      } else {
        RealType k3 = tokenizer.nextTokenAsDouble();
        RealType k2 = tokenizer.nextTokenAsDouble();
        RealType k1 = tokenizer.nextTokenAsDouble();
        RealType k0 = tokenizer.nextTokenAsDouble();

        if (trans180_)
          torsionType = new CubicTorsionType(k3, k2, k1, k0);
        else
          torsionType = new CubicTorsionType(-k3, k2, -k1, k0);
      }
      break;

    case ttQuartic:
      if (nTokens < 5) {
        throw OpenMDException("TorsionTypeParser: Not enough tokens");
      } else {
        RealType k4 = tokenizer.nextTokenAsDouble();
        RealType k3 = tokenizer.nextTokenAsDouble();
        RealType k2 = tokenizer.nextTokenAsDouble();
        RealType k1 = tokenizer.nextTokenAsDouble();
        RealType k0 = tokenizer.nextTokenAsDouble();

        if (trans180_)
          torsionType = new QuarticTorsionType(k4, k3, k2, k1, k0);
        else
          torsionType = new QuarticTorsionType(k4, -k3, k2, -k1, k0);
      }
      break;

    case ttPolynomial:
      if (nTokens < 2 || nTokens % 2 != 0) {
        throw OpenMDException("TorsionTypeParser: Not enough tokens");
      } else {
        int nPairs = nTokens / 2;
        int power;
        RealType coefficient;
        torsionType = new PolynomialTorsionType();

        PolynomialTorsionType* ptt =
            dynamic_cast<PolynomialTorsionType*>(torsionType);

        for (int i = 0; i < nPairs; ++i) {
          power      = tokenizer.nextTokenAsInt();
          bool isOdd = power % 2 == 0 ? false : true;

          coefficient = tokenizer.nextTokenAsDouble();

          if (!trans180_ && isOdd) coefficient = -coefficient;

          ptt->setCoefficient(power, coefficient);
        }
      }

      break;

    case ttCharmm:

      if (nTokens < 3 || nTokens % 3 != 0) {
        throw OpenMDException("TorsionTypeParser: Not enough tokens");
      } else {
        int nSets = nTokens / 3;

        std::vector<CharmmTorsionParameter> parameters;
        for (int i = 0; i < nSets; ++i) {
          CharmmTorsionParameter currParam;
          currParam.kchi  = tokenizer.nextTokenAsDouble();
          currParam.n     = tokenizer.nextTokenAsInt();
          currParam.delta = tokenizer.nextTokenAsDouble() / 180.0 *
                            Constants::PI;  // convert to rad

          bool isOdd = currParam.n % 2 == 0 ? false : true;
          if (!trans180_) {
            currParam.delta = Constants::PI - currParam.delta;
            if (isOdd) currParam.kchi = -currParam.kchi;
          }

          parameters.push_back(currParam);
        }

        torsionType = new CharmmTorsionType(parameters);
      }

      break;

    case ttOpls:

      if (nTokens < 3) {
        throw OpenMDException("TorsionTypeParser: Not enough tokens");
      } else {
        RealType v1 = tokenizer.nextTokenAsDouble();
        RealType v2 = tokenizer.nextTokenAsDouble();
        RealType v3 = tokenizer.nextTokenAsDouble();

        torsionType = new OplsTorsionType(v1, v2, v3, trans180_);
      }

      break;

    case ttTrappe:

      if (nTokens < 4) {
        throw OpenMDException("TorsionTypeParser: Not enough tokens");
      } else {
        RealType c0 = tokenizer.nextTokenAsDouble();
        RealType c1 = tokenizer.nextTokenAsDouble();
        RealType c2 = tokenizer.nextTokenAsDouble();
        RealType c3 = tokenizer.nextTokenAsDouble();
        torsionType = new TrappeTorsionType(c0, c1, c2, c3, trans180_);
      }

      break;

    case ttHarmonic:

      if (nTokens < 2) {
        throw OpenMDException("TorsionTypeParser: Not enough tokens");
      } else {
        // Most torsions don't have specific angle information since
        // they are cosine polynomials.  This one is different,
        // however.  To match our other force field files
        // (particularly for bends):
        //
        // phi0 should be read in degrees
        // d0 should be read in kcal / mol / degrees^2

        RealType degreesPerRadian = 180.0 / Constants::PI;

        // convert to radians
        RealType phi0 = tokenizer.nextTokenAsDouble() / degreesPerRadian;

        // convert to kcal / mol / radians^2
        RealType d0 = tokenizer.nextTokenAsDouble() * pow(degreesPerRadian, 2);

        if (!trans180_) phi0 = Constants::PI - phi0;

        torsionType = new HarmonicTorsionType(d0, phi0);
      }

      break;

    case ttUnknown:
    default:
      throw OpenMDException("TorsionTypeParser: Unknown Torsion Type");
    }
    return torsionType;
  }